

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
BRDFMaterial::sample
          (BRDFMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,bool emit)

{
  undefined1 auVar1 [16];
  byte bVar2;
  Vector3f *v;
  BRDFMaterial *in_RCX;
  long in_RDX;
  Vector3f *in_RSI;
  Ray *in_RDI;
  Ray *in_R8;
  Vector3f *in_R9;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  byte in_stack_00000008;
  Vector3f np;
  float z;
  float y;
  float sinTheta;
  float phi;
  float C;
  float r;
  Vector3f p2;
  Vector3f p1;
  Vector3f p0;
  Vector3f hitp;
  mt19937 *g;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Vector3f *in_stack_fffffffffffffe80;
  mt19937 *in_stack_fffffffffffffe90;
  Ray *in_stack_fffffffffffffea0;
  Vector3f *in_stack_fffffffffffffea8;
  Vector3f *in_stack_fffffffffffffeb0;
  Vector3f *in_stack_fffffffffffffeb8;
  Vector3f *in_stack_fffffffffffffec0;
  Vector3f local_a4;
  Vector3f local_98 [3];
  Vector2f *in_stack_ffffffffffffff90;
  Texture *in_stack_ffffffffffffff98;
  Vector3f local_54;
  undefined8 local_48;
  undefined7 in_stack_ffffffffffffffc0;
  
  bVar2 = in_stack_00000008 & 1;
  local_48 = *(undefined8 *)in_R9->m_elements;
  if (bVar2 != 0) {
    in_stack_fffffffffffffe90 = (mt19937 *)(in_RDI + 8);
    Vector2f::Vector2f((Vector2f *)in_stack_fffffffffffffe80,
                       (Vector2f *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Texture::get(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    ::operator*(in_stack_fffffffffffffea8,&in_stack_fffffffffffffea0->o);
    Vector3f::operator+=(in_RSI,&local_54);
  }
  v = (Vector3f *)(in_RDX + 0xc);
  ::operator-(v);
  fVar3 = Vector3f::dot((Vector3f *)in_stack_fffffffffffffe90,v);
  if (0.0 <= fVar3) {
    Ray::pos(in_RDI,(float)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    Vector3f::Vector3f(in_stack_fffffffffffffe80,
                       (Vector3f *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Vector3f::Vector3f(local_98,0.0);
    Vector3f::Vector3f(&local_a4,0.0);
    createCoordinateSystem
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    fVar4 = randf(in_stack_fffffffffffffe90);
    fVar5 = sqrtf(fVar4);
    fVar4 = randf(in_stack_fffffffffffffe90);
    fVar4 = fVar4 * 3.1415927 * 2.0;
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)-fVar5),
                             SUB6416(ZEXT464(0x3f800000),0));
    fVar6 = sqrtf(auVar1._0_4_);
    fVar5 = fVar6;
    cosf(fVar4);
    sinf(fVar4);
    ::operator*((float)((ulong)in_RDI >> 0x20),(Vector3f *)in_stack_fffffffffffffe90);
    ::operator*((float)((ulong)in_RDI >> 0x20),(Vector3f *)in_stack_fffffffffffffe90);
    ::operator+(in_stack_fffffffffffffea8,&in_stack_fffffffffffffea0->o);
    ::operator*((float)((ulong)in_RDI >> 0x20),(Vector3f *)in_stack_fffffffffffffe90);
    ::operator+(in_stack_fffffffffffffea8,&in_stack_fffffffffffffea0->o);
    BRDF(in_RCX,&in_R8->o,in_R9,(Hit *)CONCAT17(bVar2,in_stack_ffffffffffffffc0));
    ::operator*(in_stack_fffffffffffffea8,&in_stack_fffffffffffffea0->o);
    operator/(&in_RDI->o,(float)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    operator/(&in_RDI->o,(float)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    Vector3f::operator=(&in_R8->o,(Vector3f *)CONCAT44(fVar6,fVar5));
    Vector3f::Vector3f(&in_R8->o,(Vector3f *)CONCAT44(fVar6,fVar5));
    Vector3f::Vector3f(&in_R8->o,(Vector3f *)CONCAT44(fVar6,fVar5));
    std::numeric_limits<float>::max();
    Ray::Ray(in_stack_fffffffffffffea0,&in_RDI->o,(Vector3f *)in_stack_fffffffffffffe90,
             (float)((ulong)v >> 0x20),SUB84(v,0));
    Ray::operator=(in_R8,(Ray *)CONCAT44(fVar6,fVar5));
  }
  return 0.0 <= fVar3;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override{
		RNG_TYPE& g = *rt.g;
//		float& davg = rt.davg[this->id];
//		float& favg = rt.favg[this->id];
//		if (!this->emissionColor.empty) {
//			std::cerr << emit << "?\n";
//		}
		if(emit) col += this->emissionColor.get(hit.pos) * coe;
		if (Vector3f::dot(hit.norm, -ray.d) < 0) return 0;
		Vector3f hitp = ray.pos(hit.t);
		Vector3f p0 = hit.norm, p1, p2;
		createCoordinateSystem(p0, p1, p2);
		float r = this->roughness;
#if SAMPLER == 0
		if (0)//g() % 2)
		{
			float cog = sqrtf(randf(g)), phi = randf(g) * PI * 2;
			float sinTheta = sqrtf(1 - cog * cog);
			float C = cog * 2;
			float y = sinTheta * cosf(phi), z = sinTheta * sinf(phi);
			Vector3f np = cog * p0 + y * p1 + z * p2;
			Vector3f H = np - ray.d; H.normalize();
			float co = Vector3f::dot(H, p0);
			float D = expf((1 - 1.0 / (co * co)) / (r * r)) / (r * r * co * co * co);
			if (D < 0) D = 0;
			coe = coe * this->BRDF0(ray.d, np, hit) / cog;
//			coe = coe * this->BRDF0(ray.d, np, hit) / cog / 2 * 2;// *((C * C) / (C * C + D * D)) * 2;
			ray = Ray(hitp, np);
		}
		else
		{
			int fail = 0;
			while (1)
			{
				float u = randf(g);
				float co = sqrtf(1 / (1 - r * r * logf(1 - u)));
				float d = expf((1 - 1.0 / (co * co)) / (r * r)) / (r * r * co * co * co);
				//			float D = d;// / co;
				float phi = randf(g) * 2 * PI, g = sqrtf(1 - co * co);
				Vector3f H = p0 * co + (p1 * cosf(phi) + p2 * sinf(phi)) * g;
				Vector3f np = H * 2 * Vector3f::dot(H, -ray.d) + ray.d; np.normalize();
				if (Vector3f::dot(np, p0) < 0)
				{
					fail++;
					if (fail >= 20)
					{
						return 0;
					}
					continue;
				}
				//			float C = Vector3f::dot(p0, np) * 2;
				d /= Vector3f::dot(np, H) * 2;
				davg = davg * 0.95 + 0.05 * d;
				favg = favg * 0.95 + 0.05 * (1 + fail);
				coe = coe * this->BRDF(ray.d, np, hit) / d * (davg/favg) / 2;
				//				coe = coe * this->BRDF1(ray.d, np, hit) / d * davg * 2;
//				coe = coe * this->BRDF1(ray.d, np, hit) * davg / d;// *2;// *((D * D) / (C * C + D * D)) * 2;
				ray = Ray(hitp, np);
				break;
			}
		}
#elif SAMPLER == 1
		float C = sqrtf(randf(g)), phi = randf(g) * PI * 2;
		float sinTheta = sqrtf(1 - C * C);
		float y = sinTheta * cosf(phi), z = sinTheta * sinf(phi);
		Vector3f np = C * p0 + y * p1 + z * p2;
		coe = coe * this->BRDF(ray.d, np, hit) / C / 2;
		ray = Ray(hitp, np);
#else
		float C = randf(g), phi = randf(g) * PI * 2;
		float sinTheta = sqrtf(1 - C * C);
		float y = sinTheta * cosf(phi), z = sinTheta * sinf(phi);
		Vector3f np = C * p0 + y * p1 + z * p2;
		coe = coe * this->BRDF(ray.d, np, hit);
		ray = Ray(hitp, np);
#endif
#undef SAMPLER
		return 1;
	}